

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
units::getMultiplierString_abi_cxx11_
          (string *__return_storage_ptr__,units *this,double multiplier,bool numOnly)

{
  char cVar1;
  bool bVar2;
  pointer pvVar3;
  ostream *this_00;
  ulong uVar4;
  allocator local_20a;
  allocator local_209;
  undefined4 local_208;
  allocator local_201;
  undefined1 local_200 [8];
  __string_type rv;
  stringstream local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [376];
  int local_50;
  int P;
  allocator local_39;
  _Node_iterator_base<std::pair<const_float,_char>,_false> local_38;
  float local_2c;
  _Node_iterator_base<std::pair<const_float,_char>,_false> local_28;
  const_iterator si;
  bool numOnly_local;
  double multiplier_local;
  
  si.super__Node_iterator_base<std::pair<const_float,_char>,_false>._M_cur._7_1_ = (byte)this & 1;
  if ((multiplier == 1.0) && (!NAN(multiplier))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (((ulong)this & 1) == 0) {
    local_2c = (float)multiplier;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<float,_char,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_char>_>_>
         ::find((unordered_map<float,_char,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_char>_>_>
                 *)si_prefixes,&local_2c);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<float,_char,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_char>_>_>
         ::end((unordered_map<float,_char,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_char>_>_>
                *)si_prefixes);
    bVar2 = std::__detail::operator!=(&local_28,&local_38);
    if (bVar2) {
      pvVar3 = std::__detail::_Node_const_iterator<std::pair<const_float,_char>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_float,_char>,_false,_false> *)
                          &local_28);
      cVar1 = pvVar3->second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,1,cVar1,&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      return __return_storage_ptr__;
    }
  }
  local_50 = 0x12;
  std::__cxx11::stringstream::stringstream(local_1d8);
  rv.field_2._12_4_ = std::setprecision(local_50);
  this_00 = std::operator<<(local_1c8,(_Setprecision)rv.field_2._12_4_);
  std::ostream::operator<<(this_00,multiplier);
  std::__cxx11::stringstream::str();
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < 5) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_200,"inf");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"1.00000000000000*(infinity)",&local_201);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      goto LAB_001adddd;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_200,"-inf");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"1.00000000000000*(-1.00000000000000*infinity)",
                 &local_209);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      goto LAB_001adddd;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_200,"nan");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"1.00000000000000*(nan)",&local_20a);
      std::allocator<char>::~allocator((allocator<char> *)&local_20a);
      goto LAB_001adddd;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_200);
LAB_001adddd:
  local_208 = 1;
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::stringstream::~stringstream(local_1d8);
  return __return_storage_ptr__;
}

Assistant:

static std::string getMultiplierString(double multiplier, bool numOnly = false)
{
    if (multiplier == 1.0) {
        return {};
    }
    if (!numOnly) {
        auto si = si_prefixes.find(static_cast<float>(multiplier));
        if (si != si_prefixes.end()) {
            // NOLINTNEXTLINE(
            return std::string(1UL, si->second);
        }
    }
    int P = 18;  // the desired precision
    std::stringstream ss;

    ss << std::setprecision(P) << multiplier;
    auto rv = ss.str();
    if (rv.size() <= 4) {
        // modify some improper strings that cause issues later on
        // some platforms don't produce these
        if (rv == "inf") {
            return "1.00000000000000*(infinity)";  // LCOV_EXCL_LINE
        }
        if (rv == "-inf") {
            return "1.00000000000000*(-1.00000000000000*infinity)";  // LCOV_EXCL_LINE
        }
        if (rv == "nan") {
            return "1.00000000000000*(nan)";  // LCOV_EXCL_LINE
        }
    }
    return rv;
}